

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_H_upper.c
# Opt level: O0

void test_option_H_upper(void)

{
  wchar_t wVar1;
  char *in_RAX;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *in_stack_00000018;
  wchar_t in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  undefined4 in_stack_00000030;
  wchar_t in_stack_00000034;
  char *in_stack_00000038;
  wchar_t in_stack_00000094;
  char *in_stack_00000098;
  wchar_t in_stack_000000a4;
  char *in_stack_000000a8;
  char *pcVar2;
  
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                   ,L' ');
    test_skipping("Can\'t test symlinks on this filesystem");
  }
  else {
    assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
    assertion_chdir(in_stack_00000008,unaff_retaddr_00,in_RAX);
    assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,in_RAX,(char *)0x10d780);
    assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                        in_stack_00000020,in_stack_00000018);
    assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                        in_stack_00000020,in_stack_00000018);
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,in_RAX,(char *)0x10d7eb);
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,in_RAX,(char *)0x10d80a);
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,in_RAX,(char *)0x10d829);
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,in_RAX,(char *)0x10d848);
    assertion_chdir(in_stack_00000008,unaff_retaddr_00,in_RAX);
    assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
    systemf("%s -cf test1/archive.tar -C in . >test1/c.out 2>test1/c.err",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x10d8c3,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
    assertion_chdir(in_stack_00000008,unaff_retaddr_00,pcVar2);
    systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x10d921,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10d940);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10d95f);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10d97e);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10d99d);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10d9bc);
    assertion_chdir(in_stack_00000008,unaff_retaddr_00,pcVar2);
    assertion_make_dir(in_stack_00000008,unaff_retaddr_00,pcVar2,L'\0');
    systemf("%s -cf test2/archive.tar -H -C in . >test2/c.out 2>test2/c.err",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x10da37,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
    assertion_chdir(in_stack_00000008,unaff_retaddr_00,pcVar2);
    systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x10da95,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10dab4);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10dad3);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10daf2);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10db11);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10db30);
    assertion_chdir(in_stack_00000008,unaff_retaddr_00,pcVar2);
    assertion_make_dir(in_stack_00000008,unaff_retaddr_00,pcVar2,L'\0');
    systemf("%s -cf test3/archive.tar -H -C in ld1 d1 link2 linkY >test2/c.out 2>test2/c.err",
            testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x10dbab,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
    assertion_chdir(in_stack_00000008,unaff_retaddr_00,pcVar2);
    systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x10dc09,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
    assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10dc45);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10dc64);
    assertion_is_reg(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x10dca0);
    assertion_chdir(in_stack_00000008,unaff_retaddr_00,pcVar2);
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_H_upper)
{

	if (!canSymlink()) {
		skipping("Can't test symlinks on this filesystem");
		return;
	}

	/*
	 * Create a sample archive.
	 */
	assertMakeDir("in", 0755);
	assertChdir("in");
	assertMakeDir("d1", 0755);
	assertMakeSymlink("ld1", "d1");
	assertMakeFile("d1/file1", 0644, "d1/file1");
	assertMakeFile("d1/file2", 0644, "d1/file2");
	assertMakeSymlink("d1/link1", "file1");
	assertMakeSymlink("d1/linkX", "fileX");
	assertMakeSymlink("link2", "d1/file2");
	assertMakeSymlink("linkY", "d1/fileY");
	assertChdir("..");

	/* Test 1: Without -H */
	assertMakeDir("test1", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test1/archive.tar -C in . >test1/c.out 2>test1/c.err", testprog));
	assertChdir("test1");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsSymlink("ld1", "d1");
	assertIsSymlink("d1/link1", "file1");
	assertIsSymlink("d1/linkX", "fileX");
	assertIsSymlink("link2", "d1/file2");
	assertIsSymlink("linkY", "d1/fileY");
	assertChdir("..");

	/* Test 2: With -H, no symlink on command line. */
	assertMakeDir("test2", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test2/archive.tar -H -C in . >test2/c.out 2>test2/c.err", testprog));
	assertChdir("test2");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsSymlink("ld1", "d1");
	assertIsSymlink("d1/link1", "file1");
	assertIsSymlink("d1/linkX", "fileX");
	assertIsSymlink("link2", "d1/file2");
	assertIsSymlink("linkY", "d1/fileY");
	assertChdir("..");

	/* Test 3: With -H, some symlinks on command line. */
	assertMakeDir("test3", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test3/archive.tar -H -C in ld1 d1 link2 linkY >test2/c.out 2>test2/c.err", testprog));
	assertChdir("test3");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsDir("ld1", 0755);
	assertIsSymlink("d1/linkX", "fileX");
	assertIsSymlink("d1/link1", "file1");
	assertIsReg("link2", 0644);
	assertIsSymlink("linkY", "d1/fileY");
	assertChdir("..");
}